

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O3

void __thiscall
cppnet::Dispatcher::Connect::anon_class_48_3_02cd77fa::operator()(anon_class_48_3_02cd77fa *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  Dispatcher *pDVar3;
  int iVar4;
  element_type *peVar5;
  bool bVar6;
  shared_ptr<cppnet::RWSocket> sock;
  long *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  element_type *local_40;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  long local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  pDVar3 = this->this;
  MakeRWSocket();
  std::__shared_ptr<cppnet::Dispatcher,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppnet::Dispatcher,void>
            ((__shared_ptr<cppnet::Dispatcher,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             (__weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2> *)
             &pDVar3->super_enable_shared_from_this<cppnet::Dispatcher>);
  local_60[0xc] = local_30;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 0xd),&local_28);
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  local_40 = (pDVar3->_event_actions).
             super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38._M_pi =
       (pDVar3->_event_actions).super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_weak_count = (local_38._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_weak_count = (local_38._M_pi)->_M_weak_count + 1;
    }
  }
  local_60[10] = (long)local_40;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 0xb),&local_38);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_38._M_pi)->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = (local_38._M_pi)->_M_weak_count;
      (local_38._M_pi)->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*(local_38._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  local_48._M_pi =
       (pDVar3->_cppnet_base).super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = (local_48._M_pi)->_M_use_count;
    do {
      if (iVar4 == 0) {
        local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_0010a556;
      }
      LOCK();
      iVar2 = (local_48._M_pi)->_M_use_count;
      bVar6 = iVar4 == iVar2;
      if (bVar6) {
        (local_48._M_pi)->_M_use_count = iVar4 + 1;
        iVar2 = iVar4;
      }
      iVar4 = iVar2;
      UNLOCK();
    } while (!bVar6);
    if ((local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       ((local_48._M_pi)->_M_use_count != 0)) {
      peVar5 = (pDVar3->_cppnet_base).
               super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      goto LAB_0010a558;
    }
  }
LAB_0010a556:
  peVar5 = (element_type *)0x0;
LAB_0010a558:
  local_60[8] = (long)peVar5;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 9),&local_48);
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  (**(code **)(*local_60 + 0x48))(local_60,this,this->port);
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

void Dispatcher::Connect(const std::string& ip, uint16_t port) {
    auto task = [ip, port, this]() {
        auto sock = MakeRWSocket();
        sock->SetDispatcher(shared_from_this());
        sock->SetEventActions(_event_actions);
        sock->SetCppNetBase(_cppnet_base.lock());
        sock->Connect(ip, port);
    };

    if (std::this_thread::get_id() == _local_thread_id) {
        task();

    } else {
        PostTask(task);
    }
}